

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderIntermediate.h
# Opt level: O0

void __thiscall
Assimp::Blender::TempArray<std::vector,_aiMaterial>::~TempArray
          (TempArray<std::vector,_aiMaterial> *this)

{
  aiMaterial *this_00;
  bool bVar1;
  reference ppaVar2;
  aiMaterial *elem;
  iterator __end0;
  iterator __begin0;
  mywrap *__range3;
  TempArray<std::vector,_aiMaterial> *this_local;
  
  __end0 = ::std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::begin(&this->arr);
  elem = (aiMaterial *)::std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::end(&this->arr);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppaVar2 = __gnu_cxx::
              __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
              ::operator*(&__end0);
    this_00 = *ppaVar2;
    if (this_00 != (aiMaterial *)0x0) {
      aiMaterial::~aiMaterial(this_00);
      operator_delete(this_00,0x10);
    }
    __gnu_cxx::
    __normal_iterator<aiMaterial_**,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>::
    operator++(&__end0);
  }
  ::std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector(&this->arr);
  return;
}

Assistant:

~TempArray () {
            for(T* elem : arr) {
                delete elem;
            }
        }